

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O3

_Bool COSE_Mac_AddRecipient(HCOSE_MAC hMac,HCOSE_RECIPIENT hRecip,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *cb_value;
  COSE_MacMessage *p;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_28;
  
  local_28 = in_RAX;
  _Var1 = _COSE_IsInList(MacRoot,(COSE *)hMac);
  if ((_Var1) && (_Var1 = IsValidRecipientHandle(hRecip), _Var1)) {
    *(undefined8 *)(hRecip + 0x70) = *(undefined8 *)(hMac + 0x58);
    *(HCOSE_RECIPIENT *)(hMac + 0x58) = hRecip;
    cb_value = _COSE_arrayget_int((COSE *)hMac,4);
    if (cb_value == (cn_cbor *)0x0) {
      cb_value = cn_cbor_array_create(&local_28);
      if (cb_value != (cn_cbor *)0x0) {
        _Var1 = _COSE_array_replace((COSE *)hMac,cb_value,4,&local_28);
        if (!_Var1) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_28);
            perr->err = cVar2;
          }
          return false;
        }
        goto LAB_001f40cf;
      }
    }
    else {
LAB_001f40cf:
      _Var1 = cn_cbor_array_append(cb_value,*(cn_cbor **)(hRecip + 0x18),&local_28);
      if (_Var1) {
        *(int *)(hRecip + 0x10) = *(int *)(hRecip + 0x10) + 1;
        return true;
      }
    }
    if (perr == (cose_errback *)0x0) goto LAB_001f40f6;
    cVar2 = _MapFromCBOR(local_28);
  }
  else {
    cVar2 = COSE_ERR_INVALID_PARAMETER;
    if (perr == (cose_errback *)0x0) goto LAB_001f40f6;
  }
  perr->err = cVar2;
LAB_001f40f6:
  cn_cbor_free((cn_cbor *)0x0);
  return false;
}

Assistant:

bool COSE_Mac_AddRecipient(HCOSE_MAC hMac, HCOSE_RECIPIENT hRecip, cose_errback * perr)
{
	COSE_RecipientInfo * pRecip;
	COSE_MacMessage * pMac;
	cn_cbor * pRecipients = NULL;
	cn_cbor * pRecipientsT = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidMacHandle(hMac), COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(IsValidRecipientHandle(hRecip), COSE_ERR_INVALID_PARAMETER);

	pMac = (COSE_MacMessage *)hMac;
	pRecip = (COSE_RecipientInfo *)hRecip;

	pRecip->m_recipientNext = pMac->m_recipientFirst;
	pMac->m_recipientFirst = pRecip;

#ifdef USE_CBOR_CONTEXT
	context = &pMac->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pRecipients = _COSE_arrayget_int(&pMac->m_message, INDEX_MAC_RECIPIENTS);
	if (pRecipients == NULL) {
		pRecipientsT = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pRecipientsT != NULL, cbor_error);

		CHECK_CONDITION_CBOR(_COSE_array_replace(&pMac->m_message, pRecipientsT, INDEX_MAC_RECIPIENTS, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
		pRecipients = pRecipientsT;
		pRecipientsT = NULL;
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pRecipients, pRecip->m_encrypt.m_message.m_cbor, &cbor_error), cbor_error);
	pRecip->m_encrypt.m_message.m_refCount++;

	return true;

errorReturn:
	if (pRecipientsT == NULL) CN_CBOR_FREE(pRecipientsT, context);
	return false;
}